

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

void Abc_AigDeleteNode(Abc_Aig_t *pMan,Abc_Obj_t *pNode)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  int *piVar3;
  Abc_Obj_t *Entry;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  long lVar6;
  void *pvVar7;
  long lVar8;
  int i;
  long lVar9;
  
  while( true ) {
    if (((ulong)pNode & 1) != 0) {
      __assert_fail("!Abc_ObjIsComplement(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                    ,0x3d2,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
    }
    if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                    ,0x3d3,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
    }
    if ((pNode->vFanins).nSize != 2) {
      __assert_fail("Abc_ObjFaninNum(pNode) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                    ,0x3d4,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
    }
    if ((pNode->vFanouts).nSize != 0) break;
    lVar9 = 0;
    while( true ) {
      if (pMan->vStackReplaceOld->nSize <= (int)lVar9) break;
      pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(pMan->vStackReplaceOld,(int)lVar9);
      lVar6 = lVar9;
      if (pAVar5 == pNode) {
        while( true ) {
          pVVar1 = pMan->vStackReplaceOld;
          lVar8 = (long)pVVar1->nSize + -1;
          if (lVar8 <= lVar6) break;
          pVVar1->pArray[lVar6] = pVVar1->pArray[lVar6 + 1];
          ppvVar2 = pMan->vStackReplaceNew->pArray;
          ppvVar2[lVar6] = ppvVar2[lVar6 + 1];
          lVar6 = lVar6 + 1;
        }
        pVVar1->nSize = (int)lVar8;
        piVar3 = &pMan->vStackReplaceNew->nSize;
        *piVar3 = *piVar3 + -1;
      }
      lVar9 = lVar9 + 1;
    }
    i = 0;
    while (i < pMan->vStackReplaceNew->nSize) {
      pvVar7 = Vec_PtrEntry(pMan->vStackReplaceNew,i);
      i = i + 1;
      if (pNode == (Abc_Obj_t *)((ulong)pvVar7 & 0xfffffffffffffffe)) {
        return;
      }
    }
    piVar3 = (pNode->vFanins).pArray;
    ppvVar2 = pNode->pNtk->vObjs->pArray;
    pAVar5 = (Abc_Obj_t *)ppvVar2[*piVar3];
    Entry = (Abc_Obj_t *)ppvVar2[piVar3[1]];
    if (pMan->vUpdatedNets != (Vec_Ptr_t *)0x0) {
      Vec_PtrPushUnique(pMan->vUpdatedNets,pAVar5);
      Vec_PtrPushUnique(pMan->vUpdatedNets,Entry);
    }
    Abc_AigAndDelete(pMan,pNode);
    uVar4 = *(uint *)&pNode->field_0x14;
    if ((uVar4 & 0x10) != 0) {
      Abc_AigRemoveFromLevelStructure(pMan->vLevels,pNode);
      uVar4 = *(uint *)&pNode->field_0x14;
    }
    if ((uVar4 & 0x20) != 0) {
      Abc_AigRemoveFromLevelStructureR(pMan->vLevelsR,pNode);
    }
    Abc_NtkDeleteObj(pNode);
    if (((*(uint *)&pAVar5->field_0x14 & 0xf) == 7) && ((pAVar5->vFanouts).nSize == 0)) {
      Abc_AigDeleteNode(pMan,pAVar5);
    }
    if (((*(uint *)&Entry->field_0x14 & 0xf) != 7) || (pNode = Entry, (Entry->vFanouts).nSize != 0))
    {
      return;
    }
  }
  __assert_fail("Abc_ObjFanoutNum(pNode) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                ,0x3d5,"void Abc_AigDeleteNode(Abc_Aig_t *, Abc_Obj_t *)");
}

Assistant:

void Abc_AigDeleteNode( Abc_Aig_t * pMan, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode0, * pNode1, * pTemp;
    int i, k;

    // make sure the node is regular and dangling
    assert( !Abc_ObjIsComplement(pNode) );
    assert( Abc_ObjIsNode(pNode) );
    assert( Abc_ObjFaninNum(pNode) == 2 );
    assert( Abc_ObjFanoutNum(pNode) == 0 );

    // when deleting an old node that is scheduled for replacement, remove it from the replacement queue
    Vec_PtrForEachEntry( Abc_Obj_t *, pMan->vStackReplaceOld, pTemp, i )
        if ( pNode == pTemp )
        {
            // remove the entry from the replacement array
            for ( k = i; k < pMan->vStackReplaceOld->nSize - 1; k++ )
            {
                pMan->vStackReplaceOld->pArray[k] = pMan->vStackReplaceOld->pArray[k+1];
                pMan->vStackReplaceNew->pArray[k] = pMan->vStackReplaceNew->pArray[k+1];
            }
            pMan->vStackReplaceOld->nSize--;
            pMan->vStackReplaceNew->nSize--;
        }

    // when deleting a new node that should replace another node, do not delete
    Vec_PtrForEachEntry( Abc_Obj_t *, pMan->vStackReplaceNew, pTemp, i )
        if ( pNode == Abc_ObjRegular(pTemp) )
            return;

    // remember the node's fanins
    pNode0 = Abc_ObjFanin0( pNode );
    pNode1 = Abc_ObjFanin1( pNode );

    // add the node to the list of updated nodes
    if ( pMan->vUpdatedNets )
    {
        Vec_PtrPushUnique( pMan->vUpdatedNets, pNode0 );
        Vec_PtrPushUnique( pMan->vUpdatedNets, pNode1 );
    }

    // remove the node from the table
    Abc_AigAndDelete( pMan, pNode );
    // if the node is in the level structure, remove it
    if ( pNode->fMarkA )
        Abc_AigRemoveFromLevelStructure( pMan->vLevels, pNode );
    if ( pNode->fMarkB )
        Abc_AigRemoveFromLevelStructureR( pMan->vLevelsR, pNode );
    // remove the node from the network
    Abc_NtkDeleteObj( pNode );

    // call recursively for the fanins
    if ( Abc_ObjIsNode(pNode0) && pNode0->vFanouts.nSize == 0 )
        Abc_AigDeleteNode( pMan, pNode0 );
    if ( Abc_ObjIsNode(pNode1) && pNode1->vFanouts.nSize == 0 )
        Abc_AigDeleteNode( pMan, pNode1 );
}